

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O3

uint8_t * __thiscall
cdnsPreamble::parse_map_item(cdnsPreamble *this,uint8_t *in,uint8_t *in_max,int64_t val,int *err)

{
  cbor_text *this_00;
  uint8_t *puVar1;
  
  switch(val) {
  case 0:
    break;
  case 1:
    this = (cdnsPreamble *)&this->cdns_version_minor;
    break;
  case 2:
    this = (cdnsPreamble *)&this->cdns_version_private;
    break;
  case 3:
    if (this->cdns_version_major < 1) {
      puVar1 = cbor_map_parse<cdnsBlockParameterOld>(in,in_max,&this->old_block_parameters,err);
    }
    else {
      puVar1 = cbor_array_parse<cdnsBlockParameter>(in,in_max,&this->block_parameters,err);
    }
    goto LAB_00158a9e;
  case 4:
    this_00 = &this->old_generator_id;
    goto LAB_00158a6c;
  case 5:
    this_00 = &this->old_host_id;
LAB_00158a6c:
    puVar1 = cbor_text::parse(this_00,in,in_max,err);
    goto LAB_00158a9e;
  default:
    puVar1 = cbor_skip(in,in_max,err);
    goto LAB_00158a9e;
  }
  puVar1 = cbor_parse_int64(in,in_max,&this->cdns_version_major,0,err);
LAB_00158a9e:
  if (puVar1 == (uint8_t *)0x0) {
    parse_map_item();
  }
  return puVar1;
}

Assistant:

uint8_t* cdnsPreamble::parse_map_item(uint8_t* in, uint8_t const* in_max, int64_t val, int* err)
{
    switch (val) {
    case 0: /* Version Major */
        in = cbor_parse_int64(in, in_max, &cdns_version_major, 0, err);
        break;
    case 1: /* Version Minor */
        in = cbor_parse_int64(in, in_max, &cdns_version_minor, 0, err);
        break;
    case 2: /* Version Private */
        in = cbor_parse_int64(in, in_max, &cdns_version_private, 0, err);
        break;
    case 3: /* Block Parameters */
        if (this->cdns_version_major > 0) {
            in = cbor_array_parse(in, in_max, &block_parameters, err);
        }
        else {
            in = old_block_parameters.parse(in, in_max, err);
        }
        break;
    case 4: /* generator-id  -- only present in draft version, part of
             * block parameter collection data otherwise. */
        in = old_generator_id.parse(in, in_max, err);
        break;
    case 5: /* host-id   -- only present in draft version, part of
             * block parameter collection data otherwise. */
        in = old_host_id.parse(in, in_max, err);
        break;
    default:
        in = cbor_skip(in, in_max, err);
        break;
    }

    if (in == NULL) {
        char const* e[] = { "v_major", "v_minor", "v_private", "block_param", "generator_id", "host_id" };
        int nb_e = (int)sizeof(e) / sizeof(char const*);

        fprintf(stderr, "Cannot parse block element %d (%s), err=%d\n", (int)val, (val >= 0 && val < nb_e) ? e[val] : "unknown", *err);
    }
    return in;
}